

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this)

{
  TextReader<fmt::Locale> *this_00;
  char *loc;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  this_00 = this->reader_;
  loc = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = loc;
  (this_00->super_ReaderBase).ptr_ = loc + 1;
  if (*loc != 'v') {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)0x2620c3,&local_18);
  }
  ReadUInt(this,this->num_vars_and_exprs_);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  return;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }